

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

int Gia_RsbFindFaninAdd(int iFan,int *pFanins,int *pFaninCounts,int nFanins)

{
  int local_28;
  int i;
  int nFanins_local;
  int *pFaninCounts_local;
  int *pFanins_local;
  int iFan_local;
  
  for (local_28 = 0; (local_28 < nFanins && (pFanins[local_28] != iFan)); local_28 = local_28 + 1) {
  }
  pFanins[local_28] = iFan;
  pFaninCounts[local_28] = pFaninCounts[local_28] + 1;
  return nFanins + (uint)(local_28 == nFanins);
}

Assistant:

int Gia_RsbFindFaninAdd( int iFan, int pFanins[32], int pFaninCounts[32], int nFanins )
{
    int i;
    for ( i = 0; i < nFanins; i++ )
        if ( pFanins[i] == iFan )
            break;
    pFanins[i] = iFan;
    pFaninCounts[i]++;
    return nFanins + (i == nFanins);
}